

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t NodeId_calcSizeBinary(UA_NodeId *src,UA_DataType *_)

{
  size_t local_28;
  size_t s;
  UA_DataType *__local;
  UA_NodeId *src_local;
  
  switch(src->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
    if (((src->identifier).numeric < 0x10000) && (src->namespaceIndex < 0x100)) {
      if (((src->identifier).numeric < 0x100) && (src->namespaceIndex == 0)) {
        local_28 = 2;
      }
      else {
        local_28 = 4;
      }
    }
    else {
      local_28 = 7;
    }
    break;
  default:
    return 0;
  case UA_NODEIDTYPE_STRING:
  case UA_NODEIDTYPE_BYTESTRING:
    local_28 = String_calcSizeBinary(&(src->identifier).string,(UA_DataType *)0x0);
    local_28 = local_28 + 3;
    break;
  case UA_NODEIDTYPE_GUID:
    local_28 = 0x13;
  }
  return local_28;
}

Assistant:

static size_t
NodeId_calcSizeBinary(const UA_NodeId *UA_RESTRICT src, const UA_DataType *_) {
    size_t s = 1; // encoding byte
    switch (src->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(src->identifier.numeric > UA_UINT16_MAX || src->namespaceIndex > UA_BYTE_MAX) {
            s += 6;
        } else if(src->identifier.numeric > UA_BYTE_MAX || src->namespaceIndex > 0) {
            s += 3;
        } else {
            s += 1;
        }
        break;
    case UA_NODEIDTYPE_BYTESTRING:
    case UA_NODEIDTYPE_STRING:
        s += 2;
        s += String_calcSizeBinary(&src->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        s += 18;
        break;
    default:
        return 0;
    }
    return s;
}